

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void helper_lswx_ppc64(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t reg,uint32_t ra,
                      uint32_t rb)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uintptr_t unaff_retaddr;
  
  uVar3 = env->xer & 0x7f;
  if (uVar3 == 0) {
    return;
  }
  uVar2 = (int)uVar3 + 3U >> 2;
  if (ra != 0) {
    iVar4 = uVar2 + reg;
    if ((((int)reg <= (int)ra) && (iVar4 < 0x21)) && ((int)ra < iVar4)) goto LAB_00b68032;
    bVar1 = 0x20 < iVar4;
    if (((int)ra < (int)reg) && (0x20 < iVar4)) {
      bVar1 = (int)ra < iVar4 + -0x20;
    }
    if (bVar1) goto LAB_00b68032;
  }
  iVar4 = uVar2 + reg;
  if ((((int)rb < (int)reg) || (0x20 < iVar4)) || (iVar4 <= (int)rb)) {
    bVar1 = 0x20 < iVar4;
    if (((int)rb < (int)reg) && (0x20 < iVar4)) {
      bVar1 = (int)rb < iVar4 + -0x20;
    }
    if (!bVar1) {
      do_lsw(env,addr,(uint)env->xer & 0x7f,reg,unaff_retaddr);
      return;
    }
  }
LAB_00b68032:
  helper_lswx_ppc64_cold_1();
  return;
}

Assistant:

void helper_lswx(CPUPPCState *env, target_ulong addr, uint32_t reg,
                 uint32_t ra, uint32_t rb)
{
    if (likely(xer_bc != 0)) {
        int num_used_regs = DIV_ROUND_UP(xer_bc, 4);
        if (unlikely((ra != 0 && lsw_reg_in_range(reg, num_used_regs, ra)) ||
                     lsw_reg_in_range(reg, num_used_regs, rb))) {
            raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                                   POWERPC_EXCP_INVAL |
                                   POWERPC_EXCP_INVAL_LSWX, GETPC());
        } else {
            do_lsw(env, addr, xer_bc, reg, GETPC());
        }
    }
}